

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

size_t __thiscall
clog::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
size(BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this)

{
  size_type sVar1;
  lock_guard<std::mutex> local_18;
  MutexLockGuard lock;
  BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  lock._M_device = &this->_mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->_mutex);
  sVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->_queue);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return sVar1;
}

Assistant:

size_t size() const 
    {
        MutexLockGuard lock(_mutex);
        return _queue.size();
    }